

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O1

wchar_t map_bind(EditLine *el,wchar_t argc,wchar_t **argv)

{
  el_bindings_t *peVar1;
  el_action_t *peVar2;
  size_t sVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  wchar_t wVar7;
  wchar_t *pwVar8;
  wchar_t *pwVar9;
  keymacro_value_t *pkVar10;
  wint_t wVar11;
  char *__format;
  FILE *__stream;
  long lVar12;
  el_bindings_t *peVar13;
  bool bVar14;
  wchar_t outbuf [1024];
  wchar_t inbuf [1024];
  el_action_t *local_2048;
  wchar_t local_2038 [1024];
  wchar_t local_1038 [1026];
  
  if (argv == (wchar_t **)0x0) {
    return L'\xffffffff';
  }
  pwVar8 = argv[1];
  bVar14 = pwVar8 == (wchar_t *)0x0;
  if (!bVar14) {
    local_2048 = (el->el_map).key;
    bVar5 = false;
    if (*pwVar8 == L'-') {
      lVar12 = 1;
      bVar4 = false;
      bVar5 = false;
      bVar6 = false;
      do {
        wVar7 = pwVar8[1];
        switch(wVar7) {
        case L'k':
          bVar6 = true;
          break;
        case L'l':
          sVar3 = (el->el_map).nfunc;
          if ((long)sVar3 < 1) {
            return L'\0';
          }
          peVar13 = (el->el_map).help;
          peVar1 = peVar13 + sVar3;
          do {
            fprintf((FILE *)el->el_outfile,"%ls\n\t%ls\n",peVar13->name,peVar13->description);
            peVar13 = peVar13 + 1;
          } while (peVar13 < peVar1);
          return L'\0';
        case L'm':
        case L'n':
        case L'o':
        case L'p':
        case L'q':
        case L't':
        case L'u':
switchD_0010c947_caseD_6d:
          fprintf((FILE *)el->el_errfile,"%ls: Invalid switch `%lc\'.\n",*argv);
          break;
        case L'r':
          bVar4 = true;
          break;
        case L's':
          bVar5 = true;
          break;
        case L'v':
          map_init_vi(el);
          return L'\0';
        default:
          if (wVar7 != L'a') {
            if (wVar7 == L'e') {
              map_init_emacs(el);
              return L'\0';
            }
            goto switchD_0010c947_caseD_6d;
          }
          local_2048 = (el->el_map).alt;
        }
        pwVar8 = argv[lVar12 + 1];
        bVar14 = pwVar8 == (wchar_t *)0x0;
        if (bVar14) goto LAB_0010c9dc;
        lVar12 = lVar12 + 1;
      } while (*pwVar8 == L'-');
      bVar6 = !bVar6;
      bVar4 = !bVar4;
    }
    else {
      bVar6 = true;
      lVar12 = 1;
      bVar4 = true;
    }
    if (!bVar14) {
      if ((bVar6) && (pwVar8 = parse__string(local_1038,pwVar8), pwVar8 == (wchar_t *)0x0)) {
        __stream = (FILE *)el->el_errfile;
        pwVar8 = *argv;
        __format = "%ls: Invalid \\ or ^ in instring.\n";
LAB_0010ccd7:
        fprintf(__stream,__format,pwVar8);
        return L'\xffffffff';
      }
      if (!bVar4) {
        if (!bVar6) {
          terminal_clear_arrow(el,pwVar8);
          return L'\xffffffff';
        }
        if ((pwVar8[1] == L'\0') && (local_2048[(byte)*pwVar8] != '\x19')) {
          local_2048[(byte)*pwVar8] = '\x1c';
          return L'\0';
        }
        keymacro_delete(el,pwVar8);
        return L'\0';
      }
      pwVar9 = argv[lVar12 + 1];
      if (pwVar9 != (wchar_t *)0x0) {
        if (!bVar5) {
          wVar7 = parse_cmd(el,pwVar9);
          if (wVar7 == L'\xffffffff') {
            fprintf((FILE *)el->el_errfile,"%ls: Invalid command `%ls\'.\n",*argv,argv[lVar12 + 1]);
            return L'\xffffffff';
          }
          if (bVar6) {
            if (pwVar8[1] == L'\0') {
              keymacro_clear(el,local_2048,pwVar8);
              local_2048[(byte)*pwVar8] = (el_action_t)wVar7;
              return L'\0';
            }
            pkVar10 = keymacro_map_cmd(el,wVar7);
            keymacro_add(el,pwVar8,pkVar10,L'\0');
            local_2048[(byte)*pwVar8] = '\x19';
            return L'\0';
          }
          pkVar10 = keymacro_map_cmd(el,wVar7);
          terminal_set_arrow(el,pwVar8,pkVar10,L'\0');
          return L'\0';
        }
        pwVar9 = parse__string(local_2038,pwVar9);
        if (pwVar9 != (wchar_t *)0x0) {
          pkVar10 = keymacro_map_str(el,pwVar9);
          if (bVar6) {
            keymacro_add(el,pwVar8,pkVar10,L'\x01');
          }
          else {
            terminal_set_arrow(el,pwVar8,pkVar10,L'\x01');
          }
          local_2048[(byte)*pwVar8] = '\x19';
          return L'\0';
        }
        __stream = (FILE *)el->el_errfile;
        pwVar8 = *argv;
        __format = "%ls: Invalid \\ or ^ in outstring.\n";
        goto LAB_0010ccd7;
      }
      if (bVar6) {
        map_print_key(el,local_2048,pwVar8);
        return L'\0';
      }
      goto LAB_0010caea;
    }
  }
LAB_0010c9dc:
  fwrite("Standard key bindings\n",0x16,1,(FILE *)el->el_outfile);
  lVar12 = 0;
  wVar11 = 0;
  do {
    peVar2 = (el->el_map).key;
    if (peVar2[(int)wVar11] != peVar2[lVar12]) {
      map_print_some_keys(el,peVar2,wVar11,(wint_t)lVar12 - 1);
      wVar11 = (wint_t)lVar12;
    }
    lVar12 = lVar12 + 1;
  } while (lVar12 != 0x100);
  map_print_some_keys(el,(el->el_map).key,wVar11,0xff);
  fwrite("Alternative key bindings\n",0x19,1,(FILE *)el->el_outfile);
  lVar12 = 0;
  wVar11 = 0;
  do {
    peVar2 = (el->el_map).alt;
    if (peVar2[(int)wVar11] != peVar2[lVar12]) {
      map_print_some_keys(el,peVar2,wVar11,(wint_t)lVar12 - 1);
      wVar11 = (wint_t)lVar12;
    }
    lVar12 = lVar12 + 1;
  } while (lVar12 != 0x100);
  map_print_some_keys(el,(el->el_map).alt,wVar11,0xff);
  fwrite("Multi-character bindings\n",0x19,1,(FILE *)el->el_outfile);
  keymacro_print(el,anon_var_dwarf_16ea1 + 3);
  fwrite("Arrow key bindings\n",0x13,1,(FILE *)el->el_outfile);
  pwVar8 = anon_var_dwarf_16ea1 + 3;
LAB_0010caea:
  terminal_print_arrow(el,pwVar8);
  return L'\0';
}

Assistant:

libedit_private int
map_bind(EditLine *el, int argc, const wchar_t **argv)
{
	el_action_t *map;
	int ntype, rem;
	const wchar_t *p;
	wchar_t inbuf[EL_BUFSIZ];
	wchar_t outbuf[EL_BUFSIZ];
	const wchar_t *in = NULL;
	wchar_t *out;
	el_bindings_t *bp, *ep;
	int cmd;
	int key;

	if (argv == NULL)
		return -1;

	map = el->el_map.key;
	ntype = XK_CMD;
	key = rem = 0;
	for (argc = 1; (p = argv[argc]) != NULL; argc++)
		if (p[0] == '-')
			switch (p[1]) {
			case 'a':
				map = el->el_map.alt;
				break;

			case 's':
				ntype = XK_STR;
				break;
			case 'k':
				key = 1;
				break;

			case 'r':
				rem = 1;
				break;

			case 'v':
				map_init_vi(el);
				return 0;

			case 'e':
				map_init_emacs(el);
				return 0;

			case 'l':
				ep = &el->el_map.help[el->el_map.nfunc];
				for (bp = el->el_map.help; bp < ep; bp++)
					(void) fprintf(el->el_outfile,
					    "%ls\n\t%ls\n",
					    bp->name, bp->description);
				return 0;
			default:
				(void) fprintf(el->el_errfile,
				    "%ls: Invalid switch `%lc'.\n",
				    argv[0], (wint_t)p[1]);
			}
		else
			break;

	if (argv[argc] == NULL) {
		map_print_all_keys(el);
		return 0;
	}
	if (key)
		in = argv[argc++];
	else if ((in = parse__string(inbuf, argv[argc++])) == NULL) {
		(void) fprintf(el->el_errfile,
		    "%ls: Invalid \\ or ^ in instring.\n",
		    argv[0]);
		return -1;
	}
	if (rem) {
		if (key) {
			(void) terminal_clear_arrow(el, in);
			return -1;
		}
		if (in[1])
			(void) keymacro_delete(el, in);
		else if (map[(unsigned char) *in] == ED_SEQUENCE_LEAD_IN)
			(void) keymacro_delete(el, in);
		else
			map[(unsigned char) *in] = ED_UNASSIGNED;
		return 0;
	}
	if (argv[argc] == NULL) {
		if (key)
			terminal_print_arrow(el, in);
		else
			map_print_key(el, map, in);
		return 0;
	}
#ifdef notyet
	if (argv[argc + 1] != NULL) {
		bindkeymacro_usage();
		return -1;
	}
#endif

	switch (ntype) {
	case XK_STR:
		if ((out = parse__string(outbuf, argv[argc])) == NULL) {
			(void) fprintf(el->el_errfile,
			    "%ls: Invalid \\ or ^ in outstring.\n", argv[0]);
			return -1;
		}
		if (key)
			terminal_set_arrow(el, in, keymacro_map_str(el, out), ntype);
		else
			keymacro_add(el, in, keymacro_map_str(el, out), ntype);
		map[(unsigned char) *in] = ED_SEQUENCE_LEAD_IN;
		break;

	case XK_CMD:
		if ((cmd = parse_cmd(el, argv[argc])) == -1) {
			(void) fprintf(el->el_errfile,
			    "%ls: Invalid command `%ls'.\n",
			    argv[0], argv[argc]);
			return -1;
		}
		if (key)
			terminal_set_arrow(el, in, keymacro_map_cmd(el, cmd), ntype);
		else {
			if (in[1]) {
				keymacro_add(el, in, keymacro_map_cmd(el, cmd), ntype);
				map[(unsigned char) *in] = ED_SEQUENCE_LEAD_IN;
			} else {
				keymacro_clear(el, map, in);
				map[(unsigned char) *in] = (el_action_t)cmd;
			}
		}
		break;

	/* coverity[dead_error_begin] */
	default:
		EL_ABORT((el->el_errfile, "Bad XK_ type %d\n", ntype));
		break;
	}
	return 0;
}